

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::writeSysexGlobal(Synth *this,Bit32u addr,Bit8u *sysex,Bit32u len)

{
  bool bVar1;
  MemoryRegion *region;
  uint uVar2;
  Bit32u len_00;
  uint uVar3;
  
  do {
    region = findMemoryRegion(this,addr);
    if (region == (MemoryRegion *)0x0) {
      bVar1 = false;
      printDebug(this,"Sysex write to unrecognised address %06x, len %d",
                 (ulong)((addr & 0x7f) + (addr & 0x3f80) * 2 + (addr & 0x1fc000) * 4),(ulong)len);
    }
    else {
      uVar2 = region->entries * region->entrySize + region->startAddr;
      len_00 = len;
      if (uVar2 < len + addr) {
        len_00 = uVar2 - addr;
      }
      writeMemoryRegion(this,region,addr,len_00,sysex);
      uVar2 = region->entries * region->entrySize + region->startAddr;
      uVar3 = uVar2 - addr;
      if (uVar3 == 0 || len + addr <= uVar2) {
        bVar1 = false;
      }
      else {
        sysex = sysex + uVar3;
        len = len - uVar3;
        bVar1 = true;
        addr = uVar2;
      }
    }
  } while (bVar1);
  return;
}

Assistant:

void Synth::writeSysexGlobal(Bit32u addr, const Bit8u *sysex, Bit32u len) {
	for (;;) {
		// Find the appropriate memory region
		const MemoryRegion *region = findMemoryRegion(addr);

		if (region == NULL) {
			printDebug("Sysex write to unrecognised address %06x, len %d", MT32EMU_SYSEXMEMADDR(addr), len);
			// FIXME: Real devices may respond differently to a long SysEx that covers adjacent regions.
			break;
		}
		writeMemoryRegion(region, addr, region->getClampedLen(addr, len), sysex);

		Bit32u next = region->next(addr, len);
		if (next == 0) {
			break;
		}
		addr += next;
		sysex += next;
		len -= next;
	}
}